

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  word **this_00;
  bool bVar1;
  char *pcVar2;
  Orphan<capnp::Text> *value;
  Builder local_278;
  bool local_259;
  undefined1 local_258 [7];
  bool _kj_shouldLog;
  char (*local_240) [9];
  undefined1 local_238 [8];
  DebugComparison<const_char_(&)[9],_capnp::Text::Builder> _kjCondition_1;
  Builder root;
  BuilderFor<capnp::Text> local_1c0;
  size_t local_1a8;
  uint local_19c;
  Fault local_198;
  Fault f;
  size_t local_178;
  uint local_170;
  DebugExpression<unsigned_int> local_16c;
  undefined1 local_168 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder builder;
  TestCase211 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::Text>((Orphan<capnp::Text> *)local_120,&local_130,8);
  local_170 = 8;
  local_16c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_170);
  Orphan<capnp::Text>::get((BuilderFor<capnp::Text> *)&f,(Orphan<capnp::Text> *)local_120);
  local_178 = Text::Builder::size((Builder *)&f);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_168,&local_16c,&local_178);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
  if (bVar1) {
    Orphan<capnp::Text>::get
              ((BuilderFor<capnp::Text> *)&root._builder.dataSize,(Orphan<capnp::Text> *)local_120);
    pcVar2 = Text::Builder::begin((Builder *)&root._builder.dataSize);
    builtin_strncpy(pcVar2,"12345678",8);
    MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Builder *)&_kjCondition_1.result,(MessageBuilder *)&orphan.builder.location);
    value = kj::mv<capnp::Orphan<capnp::Text>>((Orphan<capnp::Text> *)local_120);
    capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField
              ((Builder *)&_kjCondition_1.result,value);
    local_240 = (char (*) [9])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [9])"12345678");
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              ((Builder *)local_258,(Builder *)&_kjCondition_1.result);
    kj::_::DebugExpression<char_const(&)[9]>::operator==
              ((DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)local_238,
               (DebugExpression<char_const(&)[9]> *)&local_240,(Builder *)local_258);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
    if (!bVar1) {
      local_259 = kj::_::Debug::shouldLog(ERROR);
      while (local_259 != false) {
        capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                  (&local_278,(Builder *)&_kjCondition_1.result);
        kj::_::Debug::
        log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Builder>&,char_const(&)[9],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0xdc,ERROR,
                   "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", _kjCondition, \"12345678\", root.getTextField()"
                   ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                   (DebugComparison<const_char_(&)[9],_capnp::Text::Builder> *)local_238,
                   (char (*) [9])"12345678",&local_278);
        local_259 = false;
      }
    }
    Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_120);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
    return;
  }
  local_19c = 8;
  Orphan<capnp::Text>::get(&local_1c0,(Orphan<capnp::Text> *)local_120);
  local_1a8 = Text::Builder::size(&local_1c0);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xd7,FAILED,"(8u) == (orphan.get().size())","_kjCondition,8u, orphan.get().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_168,&local_19c,&local_1a8);
  kj::_::Debug::Fault::fatal(&local_198);
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}